

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_pathops.cc
# Opt level: O0

ctemplate * __thiscall ctemplate::Basename(ctemplate *this,string *path)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  allocator local_21;
  char *local_20;
  char *p;
  string *path_local;
  
  p = (char *)path;
  path_local = (string *)this;
  lVar2 = std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::size();
  local_20 = (char *)(lVar2 + lVar3);
  do {
    local_20 = local_20 + -1;
    pcVar5 = local_20;
    pcVar4 = (char *)std::__cxx11::string::data();
    if (pcVar5 < pcVar4) {
      std::__cxx11::string::string((string *)this,(string *)p);
      return this;
    }
    bVar1 = IsPathSep(*local_20);
  } while (!bVar1);
  pcVar5 = local_20 + 1;
  lVar2 = std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::size();
  uVar6 = ~(ulong)local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar5,uVar6 + lVar2 + lVar3,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return this;
}

Assistant:

string Basename(const string& path) {
  for (const char* p = path.data() + path.size()-1; p >= path.data(); --p) {
    if (IsPathSep(*p))
      return string(p+1, path.data() + path.size() - (p+1));
  }
  return path;   // no path-separator found, so whole string is the basename
}